

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse2::c_imm_v64_shr_n_u8<6>(c_v64 a)

{
  return (c_v64)(CONCAT26(a.u16[3] >> 6,
                          CONCAT24(a.u16[2] >> 6,CONCAT22(a.u16[1] >> 6,a.u16[0] >> 6))) &
                (ulong)DAT_00beb1b0);
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}